

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeGravityForceScale(ChElementHexaANCF_3813 *this)

{
  ChVectorN<double,_8> *this_00;
  BrickGravity myformula1;
  double local_408;
  BrickGravity local_400;
  
  BrickGravity::BrickGravity(&local_400,&this->m_d0,this);
  this_00 = &this->m_GravForceScale;
  Eigen::DenseBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_> *)this_00);
  ChQuadrature::Integrate3D<Eigen::Matrix<double,8,1,0,8,1>>
            (this_00,&local_400.super_ChIntegrable3D<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,-1.0,1.0
             ,-1.0,1.0,-1.0,1.0,2);
  local_408 = (((this->m_Material).
                super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChContinuumMaterial).density;
  Eigen::DenseBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_> *)this_00,&local_408);
  return;
}

Assistant:

void ChElementHexaANCF_3813::ComputeGravityForceScale() {
    BrickGravity myformula1(&m_d0, this);
    m_GravForceScale.setZero();
    ChQuadrature::Integrate3D<ChVectorN<double, 8>>(m_GravForceScale,  // result of integration will go there
                                                    myformula1,        // formula to integrate
                                                    -1, 1,             // limits in x direction
                                                    -1, 1,             // limits in y direction
                                                    -1, 1,             // limits in z direction
                                                    2                  // order of integration
    );

    m_GravForceScale *= m_Material->Get_density();
}